

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::ConfigDeclarationSyntax::getChild
          (TokenOrSyntax *__return_storage_ptr__,ConfigDeclarationSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  Token token_01;
  Token token_02;
  Token token_03;
  Token token_04;
  SyntaxNode *local_d0;
  SyntaxNode *local_c0;
  SyntaxNode *local_b0;
  SyntaxNode *local_a0;
  size_t index_local;
  ConfigDeclarationSyntax *this_local;
  
  switch(index) {
  case 0:
    local_a0 = (SyntaxNode *)0x0;
    if (this != (ConfigDeclarationSyntax *)0xfffffffffffffff0) {
      local_a0 = &(this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode;
    }
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,local_a0);
    break;
  case 1:
    token.kind = (this->config).kind;
    token._2_1_ = (this->config).field_0x2;
    token.numFlags.raw = (this->config).numFlags.raw;
    token.rawLen = (this->config).rawLen;
    token.info = (this->config).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token);
    break;
  case 2:
    token_00.kind = (this->name).kind;
    token_00._2_1_ = (this->name).field_0x2;
    token_00.numFlags.raw = (this->name).numFlags.raw;
    token_00.rawLen = (this->name).rawLen;
    token_00.info = (this->name).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token_00);
    break;
  case 3:
    token_01.kind = (this->semi1).kind;
    token_01._2_1_ = (this->semi1).field_0x2;
    token_01.numFlags.raw = (this->semi1).numFlags.raw;
    token_01.rawLen = (this->semi1).rawLen;
    token_01.info = (this->semi1).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token_01);
    break;
  case 4:
    local_b0 = (SyntaxNode *)0x0;
    if (this != (ConfigDeclarationSyntax *)0xffffffffffffff90) {
      local_b0 = &(this->localparams).super_SyntaxListBase.super_SyntaxNode;
    }
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,local_b0);
    break;
  case 5:
    token_02.kind = (this->design).kind;
    token_02._2_1_ = (this->design).field_0x2;
    token_02.numFlags.raw = (this->design).numFlags.raw;
    token_02.rawLen = (this->design).rawLen;
    token_02.info = (this->design).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token_02);
    break;
  case 6:
    local_c0 = (SyntaxNode *)0x0;
    if (this != (ConfigDeclarationSyntax *)0xffffffffffffff50) {
      local_c0 = &(this->topCells).super_SyntaxListBase.super_SyntaxNode;
    }
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,local_c0);
    break;
  case 7:
    token_03.kind = (this->semi2).kind;
    token_03._2_1_ = (this->semi2).field_0x2;
    token_03.numFlags.raw = (this->semi2).numFlags.raw;
    token_03.rawLen = (this->semi2).rawLen;
    token_03.info = (this->semi2).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token_03);
    break;
  case 8:
    local_d0 = (SyntaxNode *)0x0;
    if (this != (ConfigDeclarationSyntax *)0xffffffffffffff10) {
      local_d0 = &(this->rules).super_SyntaxListBase.super_SyntaxNode;
    }
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,local_d0);
    break;
  case 9:
    token_04.kind = (this->endconfig).kind;
    token_04._2_1_ = (this->endconfig).field_0x2;
    token_04.numFlags.raw = (this->endconfig).numFlags.raw;
    token_04.rawLen = (this->endconfig).rawLen;
    token_04.info = (this->endconfig).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token_04);
    break;
  case 10:
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,&this->blockName->super_SyntaxNode);
    break;
  default:
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

TokenOrSyntax ConfigDeclarationSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return &attributes;
        case 1: return config;
        case 2: return name;
        case 3: return semi1;
        case 4: return &localparams;
        case 5: return design;
        case 6: return &topCells;
        case 7: return semi2;
        case 8: return &rules;
        case 9: return endconfig;
        case 10: return blockName;
        default: return nullptr;
    }
}